

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

SRC_ERROR sinc_stereo_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  int iVar2;
  SINC_FILTER *filter;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  SRC_ERROR SVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int half_filter_chan_len;
  int iVar12;
  int channels;
  long lVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  long local_60;
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar6 = SRC_ERR_NO_PRIVATE;
  }
  else {
    channels = state->channels;
    lVar13 = (long)channels;
    filter->in_count = data->input_frames * lVar13;
    lVar10 = data->output_frames * lVar13;
    filter->out_count = lVar10;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar21 = state->last_ratio;
    SVar6 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar21) && (dVar21 <= 256.0)) {
      dVar20 = dVar21;
      if (data->src_ratio <= dVar21) {
        dVar20 = data->src_ratio;
      }
      dVar23 = state->last_position;
      dVar26 = dVar23 - (double)(int)ROUND(dVar23);
      dVar26 = (double)(~-(ulong)(dVar26 < 0.0) & (ulong)dVar26 |
                       (ulong)(dVar26 + 1.0) & -(ulong)(dVar26 < 0.0));
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar26;
      iVar14 = filter->b_len;
      lVar11 = (long)((int)ROUND(dVar23 - dVar26) * channels + filter->b_current) % (long)iVar14;
      filter->b_current = (int)lVar11;
      if (lVar10 < 1) {
        lVar11 = 0;
        lVar10 = 0;
      }
      else {
        dVar23 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
        half_filter_chan_len =
             ((int)ROUND((double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar23 / dVar20) |
                                 ~-(ulong)(dVar20 < 1.0) & (ulong)dVar23)) + 1) * channels;
        dVar20 = 1.0 / dVar21;
        iVar15 = filter->b_end;
        do {
          iVar18 = (int)lVar11;
          dVar26 = auVar28._0_8_;
          if (((iVar15 - iVar18) + iVar14) % iVar14 <= half_filter_chan_len) {
            SVar6 = prepare_data(filter,channels,data,half_filter_chan_len);
            state->error = SVar6;
            if (SVar6 != SRC_ERR_NO_ERROR) {
              return SVar6;
            }
            iVar18 = filter->b_current;
            iVar15 = filter->b_end;
            iVar14 = filter->b_len;
            if (((iVar15 - iVar18) + iVar14) % iVar14 <= half_filter_chan_len) break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end <= (double)iVar18 + dVar26 + dVar20 + 1e-20)) break;
          lVar10 = filter->out_count;
          if (lVar10 < 1) {
            local_60 = filter->out_gen;
          }
          else {
            dVar23 = state->last_ratio;
            local_60 = filter->out_gen;
            if (1e-10 < ABS(dVar23 - data->src_ratio)) {
              dVar21 = ((data->src_ratio - dVar23) * (double)local_60) / (double)lVar10 + dVar23;
            }
          }
          dVar23 = dVar21;
          if (1.0 <= dVar21) {
            dVar23 = 1.0;
          }
          dVar23 = dVar23 * (double)filter->index_inc;
          uVar17 = (uint)ROUND(dVar23 * 4096.0);
          iVar12 = (int)ROUND(dVar26 * dVar23 * 4096.0);
          channels = state->channels;
          iVar2 = filter->coeff_half_len;
          iVar7 = (iVar2 * 0x1000 - iVar12) / (int)uVar17;
          uVar19 = iVar7 * uVar17 + iVar12;
          uVar9 = iVar18 - iVar7 * channels;
          if ((int)uVar9 < 0) {
            if (((int)uVar17 < 1) || ((int)uVar19 < 0)) {
              __assert_fail("divident >= 0 && divisor > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0xa0,"int int_div_ceil(int, int)");
            }
            uVar16 = 1 - uVar9 >> 1;
            if (((uVar17 + uVar19) - 1) / uVar17 < uVar16) {
              __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x21d,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            uVar19 = uVar19 - uVar16 * uVar17;
            uVar9 = uVar9 + (1 - uVar9 & 0xfffffffe);
          }
          dVar24 = 0.0;
          dVar25 = 0.0;
          dVar27 = 0.0;
          dVar4 = 0.0;
          if (-1 < (int)uVar19) {
            uVar8 = (ulong)uVar9;
            dVar27 = 0.0;
            dVar4 = 0.0;
            do {
              uVar16 = uVar19 >> 0xc;
              if (iVar2 < (int)uVar16) {
                __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x225,
                              "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (((int)uVar9 < 0) || (iVar7 = (int)uVar8 + 1, iVar14 <= iVar7)) {
                __assert_fail("data_index >= 0 && data_index + 1 < filter->b_len",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x227,
                              "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (iVar15 <= iVar7) {
                __assert_fail("data_index + 1 < filter->b_end",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x228,
                              "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              fVar1 = filter->coeffs[uVar16];
              dVar5 = (double)(uVar19 & 0xfff) * 0.000244140625 *
                      (double)(filter->coeffs[(ulong)uVar16 + 1] - fVar1) + (double)fVar1;
              dVar27 = dVar27 + dVar5 * (double)(float)*(undefined8 *)(filter->buffer + uVar8);
              dVar4 = dVar4 + dVar5 * (double)(float)((ulong)*(undefined8 *)(filter->buffer + uVar8)
                                                     >> 0x20);
              uVar8 = uVar8 + 2;
              uVar19 = uVar19 - uVar17;
            } while (-1 < (int)uVar19);
          }
          dVar23 = dVar23 / (double)filter->index_inc;
          iVar7 = (int)(iVar2 * 0x1000 - (uVar17 - iVar12)) / (int)uVar17;
          uVar19 = iVar7 * uVar17 + (uVar17 - iVar12);
          uVar9 = (iVar7 + 1) * channels + iVar18;
          do {
            uVar16 = (int)uVar19 >> 0xc;
            if (((int)uVar16 < 0) || (iVar2 < (int)uVar16)) {
              __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x23a,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            if (((int)uVar9 < 0) || (iVar14 <= (int)(uVar9 + 1))) {
              __assert_fail("data_index >= 0 && data_index + 1 < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x23c,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            if (iVar15 <= (int)(uVar9 + 1)) {
              __assert_fail("data_index + 1 < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x23d,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            fVar1 = filter->coeffs[uVar16];
            dVar5 = (double)(uVar19 & 0xfff) * 0.000244140625 *
                    (double)(filter->coeffs[(ulong)uVar16 + 1] - fVar1) + (double)fVar1;
            dVar24 = dVar24 + dVar5 * (double)(float)*(undefined8 *)(filter->buffer + uVar9);
            dVar25 = dVar25 + dVar5 * (double)(float)((ulong)*(undefined8 *)(filter->buffer + uVar9)
                                                     >> 0x20);
            uVar19 = uVar19 - uVar17;
            uVar9 = uVar9 - 2;
          } while (0 < (int)uVar19);
          *(ulong *)(data->data_out + local_60) =
               CONCAT44((float)(dVar23 * (dVar4 + dVar25)),(float)(dVar23 * (dVar27 + dVar24)));
          dVar27 = dVar26 + 1.0 / dVar21;
          filter->out_gen = local_60 + 2;
          dVar23 = dVar27 - (double)(int)ROUND(dVar27);
          auVar22._0_8_ = ~-(ulong)(dVar23 < 0.0) & (ulong)dVar23;
          auVar22._8_8_ = 0;
          auVar3._8_4_ = auVar28._8_4_;
          auVar3._0_8_ = (ulong)(dVar23 + 1.0) & -(ulong)(dVar23 < 0.0);
          auVar3._12_4_ = auVar28._12_4_;
          auVar28 = auVar22 | auVar3;
          dVar26 = auVar28._0_8_;
          lVar11 = (long)((int)ROUND(dVar27 - dVar26) * channels + iVar18) % (long)iVar14;
          filter->b_current = (int)lVar11;
        } while (local_60 + 2 < lVar10);
        lVar10 = filter->in_used;
        lVar11 = filter->out_gen;
        lVar13 = (long)state->channels;
      }
      SVar6 = SRC_ERR_NO_ERROR;
      state->last_position = dVar26;
      state->last_ratio = dVar21;
      data->input_frames_used = lVar10 / lVar13;
      data->output_frames_gen = lVar11 / lVar13;
    }
  }
  return SVar6;
}

Assistant:

SRC_ERROR
sinc_stereo_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_stereo (filter, state->channels, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 2 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}